

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL_mock::GLTextureBuffer::setData
          (GLTextureBuffer *this,vector<float,_std::allocator<float>_> *data)

{
  pointer pfVar1;
  pointer pfVar2;
  uint uVar3;
  allocator local_29;
  string local_28;
  
  pfVar1 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  pfVar2 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  uVar3 = TextureBuffer::getTotalSize(&this->super_TextureBuffer);
  if ((long)pfVar1 - (long)pfVar2 >> 2 != (ulong)uVar3) {
    std::__cxx11::string::string
              ((string *)&local_28,"OpenGL error: texture buffer data is not the right size.",
               &local_29);
    exception(&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

void GLShaderProgram::setUniform(std::string name, unsigned int val) {
  for (GLShaderUniform& u : uniforms) {
    if (u.name == name) {
      if (u.type == RenderDataType::UInt) {
        u.isSet = true;
      } else {
        throw std::invalid_argument("Tried to set GLShaderUniform with wrong type");
      }
      return;
    }
  }
  throw std::invalid_argument("Tried to set nonexistent uniform with name " + name);
}